

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O3

void rfc5444_writer_cleanup(rfc5444_writer *writer)

{
  rfc5444_writer_pkthandler *prVar1;
  list_entity *plVar2;
  avl_node *paVar3;
  rfc5444_writer_message *prVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  rfc5444_writer_pkthandler *pkt;
  avl_node *node;
  rfc5444_writer_message *msg;
  
  if (writer == (rfc5444_writer *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x83,"void rfc5444_writer_cleanup(struct rfc5444_writer *)");
  }
  if (writer->_state == RFC5444_WRITER_NONE) {
    pkt = (rfc5444_writer_pkthandler *)(writer->_pkthandlers).next;
    plVar5 = (pkt->_pkthandle_node).prev;
    while (plVar5 != (writer->_pkthandlers).prev) {
      prVar1 = (rfc5444_writer_pkthandler *)(pkt->_pkthandle_node).next;
      rfc5444_writer_unregister_pkthandler(writer,pkt);
      pkt = prVar1;
      plVar5 = (prVar1->_pkthandle_node).prev;
    }
    plVar5 = (writer->_targets).next;
    plVar6 = plVar5->prev;
    while (plVar6 != (writer->_targets).prev) {
      plVar2 = plVar5->next;
      rfc5444_writer_unregister_target(writer,(rfc5444_writer_target *)(plVar5 + -3));
      plVar5 = plVar2;
      plVar6 = plVar2->prev;
    }
    plVar5 = (writer->_addr_tlvtype_head).next;
    plVar6 = plVar5->prev;
    while (plVar6 != (writer->_addr_tlvtype_head).prev) {
      plVar2 = plVar5->next;
      rfc5444_writer_unregister_addrtlvtype(writer,(rfc5444_writer_tlvtype *)&plVar5[-1].prev);
      plVar5 = plVar2;
      plVar6 = plVar2->prev;
    }
    node = (avl_node *)(writer->_processors).list_head.next;
    plVar6 = (writer->_processors).list_head.prev;
    plVar5 = (node->list).prev;
    if (plVar5 != plVar6) {
      do {
        paVar3 = (avl_node *)(node->list).next;
        if (plVar5 != (list_entity *)0x0 && paVar3 != (avl_node *)0x0) {
          avl_remove(&writer->_processors,node);
          plVar6 = (writer->_processors).list_head.prev;
        }
        plVar5 = (paVar3->list).prev;
        node = paVar3;
      } while (plVar5 != plVar6);
    }
    msg = (rfc5444_writer_message *)(writer->_msgcreators).list_head.next;
    plVar5 = (msg->_msgcreator_node).list.prev;
    while (plVar5 != (writer->_msgcreators).list_head.prev) {
      prVar4 = (rfc5444_writer_message *)(msg->_msgcreator_node).list.next;
      plVar5 = (msg->_provider_tree).list_head.next;
      msg->_registered = true;
      plVar6 = plVar5->prev;
      while (plVar6 != (msg->_provider_tree).list_head.prev) {
        plVar2 = plVar5->next;
        rfc5444_writer_unregister_content_provider
                  (writer,(rfc5444_writer_content_provider *)(plVar5 + -2),
                   (rfc5444_writer_tlvtype *)0x0,0);
        plVar5 = plVar2;
        plVar6 = plVar2->prev;
      }
      plVar5 = (msg->_msgspecific_tlvtype_head).next;
      plVar6 = plVar5->prev;
      while (plVar6 != (msg->_msgspecific_tlvtype_head).prev) {
        plVar2 = plVar5->next;
        rfc5444_writer_unregister_addrtlvtype(writer,(rfc5444_writer_tlvtype *)&plVar5[-1].prev);
        plVar5 = plVar2;
        plVar6 = plVar2->prev;
      }
      rfc5444_writer_unregister_message(writer,msg);
      msg = prVar4;
      plVar5 = (prVar4->_msgcreator_node).list.prev;
    }
    return;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x85,"void rfc5444_writer_cleanup(struct rfc5444_writer *)");
}

Assistant:

void
rfc5444_writer_cleanup(struct rfc5444_writer *writer) {
  struct rfc5444_writer_message *msg, *safe_msg;
  struct rfc5444_writer_pkthandler *pkt, *safe_pkt;
  struct rfc5444_writer_content_provider *provider, *safe_prv;
  struct rfc5444_writer_tlvtype *tlvtype, *safe_tt;
  struct rfc5444_writer_target *interf, *safe_interf;
  struct rfc5444_writer_postprocessor *processor, *safe_proc;

  assert(writer);
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  /* remove all packet handlers */
  list_for_each_element_safe(&writer->_pkthandlers, pkt, _pkthandle_node, safe_pkt) {
    rfc5444_writer_unregister_pkthandler(writer, pkt);
  }

  /* remove all _targets */
  list_for_each_element_safe(&writer->_targets, interf, _target_node, safe_interf) {
    rfc5444_writer_unregister_target(writer, interf);
  }

  /* remove all generic address tlvtypes */
  list_for_each_element_safe(&writer->_addr_tlvtype_head, tlvtype, _tlvtype_node, safe_tt) {
    rfc5444_writer_unregister_addrtlvtype(writer, tlvtype);
  }

  /* remove all packet postprocessors */
  avl_for_each_element_safe(&writer->_processors, processor, _node, safe_proc) {
    rfc5444_writer_unregister_postprocessor(writer, processor);
  }

  /* remove all message creators */
  avl_for_each_element_safe(&writer->_msgcreators, msg, _msgcreator_node, safe_msg) {
    /* prevent message from being freed in the middle of the processing */
    msg->_registered = true;

    /* remove all message content providers */
    avl_for_each_element_safe(&msg->_provider_tree, provider, _provider_node, safe_prv) {
      rfc5444_writer_unregister_content_provider(writer, provider, NULL, 0);
    }

    /* remove all registered address tlvs */
    list_for_each_element_safe(&msg->_msgspecific_tlvtype_head, tlvtype, _tlvtype_node, safe_tt) {
      rfc5444_writer_unregister_addrtlvtype(writer, tlvtype);
    }

    /* remove message and addresses */
    rfc5444_writer_unregister_message(writer, msg);
  }
}